

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txb_common.h
# Opt level: O3

void get_txb_ctx(BLOCK_SIZE plane_bsize,TX_SIZE tx_size,int plane,ENTROPY_CONTEXT *a,
                ENTROPY_CONTEXT *l,TXB_CTX *txb_ctx)

{
  uint uVar1;
  undefined1 auVar2 [13];
  uint3 uVar3;
  undefined1 auVar4 [13];
  undefined1 auVar5 [13];
  undefined1 auVar6 [13];
  uint5 uVar7;
  undefined1 auVar8 [13];
  undefined1 auVar9 [13];
  byte bVar10;
  int top;
  int iVar11;
  uint uVar12;
  byte bVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  undefined7 in_register_00000031;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  bool bVar21;
  bool bVar22;
  undefined4 uVar25;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  
  switch(CONCAT71(in_register_00000031,tx_size) & 0xffffffff) {
  case 0:
    txb_ctx->dc_sign_ctx =
         (int)(char)get_txb_ctx_general_dc_sign_contexts
                    [(long)*(char *)((long)&get_txb_ctx_general_signs + (ulong)((byte)*l >> 3)) +
                     (long)*(char *)((long)&get_txb_ctx_general_signs + (ulong)((byte)*a >> 3)) +
                     0x20];
    if (plane == 0) {
      if (plane_bsize != BLOCK_4X4) {
        uVar12 = (uint)(*a & 7U);
        if (3 < (*a & 7U)) {
          uVar12 = 4;
        }
        uVar14 = 4;
        if ((*l & 7U) < 4) {
          uVar14 = (uint)(*l & 7U);
        }
        uVar15 = (ulong)uVar12;
        uVar18 = (ulong)uVar14;
LAB_002362e0:
        uVar12 = (uint)(byte)get_txb_ctx_general_skip_contexts[uVar18 + uVar15 * 5];
        goto LAB_002363c2;
      }
LAB_0023629f:
      uVar12 = 0;
      goto LAB_002363c2;
    }
    iVar11 = ((uint)(plane_bsize != BLOCK_4X4) * 3 + 1) - (uint)(*a == '\0');
    bVar21 = *l == '\0';
    break;
  case 1:
    lVar17 = 0;
    uVar15 = 0;
    bVar21 = true;
    do {
      bVar22 = bVar21;
      uVar15 = (ulong)(uint)((int)uVar15 +
                            (int)*(char *)((long)&get_txb_ctx_general_signs +
                                          (ulong)((byte)a[lVar17] >> 3)));
      lVar17 = 1;
      bVar21 = false;
    } while (bVar22);
    lVar17 = 0;
    bVar21 = true;
    do {
      bVar22 = bVar21;
      uVar15 = (long)(int)uVar15 +
               (long)*(char *)((long)&get_txb_ctx_general_signs + (ulong)((byte)l[lVar17] >> 3));
      lVar17 = 1;
      bVar21 = false;
    } while (bVar22);
    txb_ctx->dc_sign_ctx = (int)(char)get_txb_ctx_general_dc_sign_contexts[uVar15 + 0x20];
    if (plane == 0) {
      if (plane_bsize != BLOCK_8X8) {
        bVar10 = (a[1] | *a) & 7;
        bVar13 = l[1] | *l;
        uVar12 = (uint)bVar10;
        if (3 < bVar10) {
          uVar12 = 4;
        }
LAB_0023626c:
        uVar14 = 4;
        if ((bVar13 & 7) < 4) {
          uVar14 = (uint)(bVar13 & 7);
        }
        uVar12 = (uint)(byte)get_txb_ctx_general_skip_contexts[(ulong)uVar14 + (ulong)uVar12 * 5];
        goto LAB_002363c2;
      }
      goto LAB_0023629f;
    }
    iVar11 = ((uint)((0x3cfff0UL >> ((ulong)plane_bsize & 0x3f) & 1) != 0) * 3 + 1) -
             (uint)(*(short *)a == 0);
    bVar21 = *(short *)l == 0;
    break;
  case 2:
    lVar17 = 0;
    uVar15 = 0;
    do {
      uVar15 = (ulong)(uint)((int)uVar15 +
                            (int)*(char *)((long)&get_txb_ctx_general_signs +
                                          (ulong)((byte)a[lVar17] >> 3)));
      lVar17 = lVar17 + 1;
    } while (lVar17 != 4);
    lVar17 = 0;
    do {
      uVar15 = (long)(int)uVar15 +
               (long)*(char *)((long)&get_txb_ctx_general_signs + (ulong)((byte)l[lVar17] >> 3));
      lVar17 = lVar17 + 1;
    } while (lVar17 != 4);
    txb_ctx->dc_sign_ctx = (int)(char)get_txb_ctx_general_dc_sign_contexts[uVar15 + 0x20];
    if (plane == 0) {
      if (plane_bsize != BLOCK_16X16) {
        uVar12 = *(uint *)a >> 0x10 | *(uint *)a;
        bVar10 = ((byte)(uVar12 >> 8) | (byte)uVar12) & 7;
        uVar12 = *(uint *)l >> 0x10 | *(uint *)l;
        bVar13 = (byte)(uVar12 >> 8) | (byte)uVar12;
        uVar12 = (uint)bVar10;
        if (3 < bVar10) {
          uVar12 = 4;
        }
        goto LAB_0023626c;
      }
      goto LAB_0023629f;
    }
    iVar11 = ((uint)((0x30ff80UL >> ((ulong)plane_bsize & 0x3f) & 1) != 0) * 3 + 1) -
             (uint)(*(int *)a == 0);
    bVar21 = *(int *)l == 0;
    break;
  case 3:
    lVar17 = 0;
    uVar15 = 0;
    do {
      uVar15 = (ulong)(uint)((int)uVar15 +
                            (int)*(char *)((long)&get_txb_ctx_general_signs +
                                          (ulong)((byte)a[lVar17] >> 3)));
      lVar17 = lVar17 + 1;
    } while (lVar17 != 8);
    lVar17 = 0;
    do {
      uVar15 = (long)(int)uVar15 +
               (long)*(char *)((long)&get_txb_ctx_general_signs + (ulong)((byte)l[lVar17] >> 3));
      lVar17 = lVar17 + 1;
    } while (lVar17 != 8);
    txb_ctx->dc_sign_ctx = (int)(char)get_txb_ctx_general_dc_sign_contexts[uVar15 + 0x20];
    if (plane == 0) {
      if (plane_bsize != BLOCK_32X32) {
        uVar12 = *(uint *)a | *(uint *)(a + 4);
        auVar2[0xc] = (char)(uVar12 >> 0x18);
        auVar2._0_12_ = ZEXT712(0);
        uVar7 = CONCAT32(auVar2._10_3_,(ushort)(byte)(uVar12 >> 0x10));
        auVar9._5_8_ = 0;
        auVar9._0_5_ = uVar7;
        auVar23[5] = 0;
        auVar23[4] = (byte)(uVar12 >> 8);
        auVar23._6_7_ = SUB137(auVar9 << 0x40,6);
        auVar23._0_4_ = uVar12 & 0xff;
        auVar23._13_3_ = 0;
        uVar25 = (undefined4)uVar7;
        uVar3 = auVar2._10_3_ >> 0x10;
        auVar27._4_3_ = uVar3;
        auVar27._0_4_ = uVar25;
        auVar27[7] = 0;
        auVar27._8_4_ = uVar25;
        auVar27._12_3_ = uVar3;
        auVar27[0xf] = 0;
        uVar12 = SUB164(auVar27 | auVar23,4) | SUB164(auVar27 | auVar23,0);
        uVar14 = *(uint *)l | *(uint *)(l + 4);
        uVar15 = (ulong)(ushort)uVar14 & 0xffffffffffff00ff;
        auVar4._8_4_ = 0;
        auVar4._0_8_ = uVar15;
        auVar4[0xc] = (char)(uVar14 >> 0x18);
        auVar5[8] = (char)(uVar14 >> 0x10);
        auVar5._0_8_ = uVar15;
        auVar5[9] = 0;
        auVar5._10_3_ = auVar4._10_3_;
        auVar8._5_8_ = 0;
        auVar8._0_5_ = auVar5._8_5_;
        auVar24._0_4_ = (undefined4)uVar15;
        auVar6[4] = (char)(uVar14 >> 8);
        auVar6._0_4_ = auVar24._0_4_;
        auVar6[5] = 0;
        auVar6._6_7_ = SUB137(auVar8 << 0x40,6);
        auVar24._4_9_ = auVar6._4_9_;
        auVar24._13_3_ = 0;
        uVar3 = auVar4._10_3_ >> 0x10;
        auVar26._4_3_ = uVar3;
        auVar26._0_4_ = auVar5._8_4_;
        auVar26[7] = 0;
        auVar26._8_4_ = auVar5._8_4_;
        auVar26._12_3_ = uVar3;
        auVar26[0xf] = 0;
        uVar14 = SUB164(auVar26 | auVar24,4) | SUB164(auVar26 | auVar24,0);
LAB_002362cb:
        uVar1 = uVar12 & 7;
        if (3 < (uVar12 & 7)) {
          uVar1 = 4;
        }
        uVar15 = (ulong)uVar1;
        uVar18 = (ulong)(uVar14 & 7);
        if (3 < (uVar14 & 7)) {
          uVar18 = 4;
        }
        goto LAB_002362e0;
      }
      goto LAB_0023629f;
    }
    iVar11 = ((uint)((ulong)plane_bsize - 10 < 6) * 3 + 1) - (uint)(*(long *)a == 0);
    bVar21 = *(long *)l == 0;
    break;
  default:
    uVar15 = (ulong)tx_size;
    uVar12 = *(uint *)((long)tx_size_wide_unit + (ulong)((uint)tx_size * 4));
    uVar18 = 1;
    if (1 < (int)uVar12) {
      uVar18 = (ulong)uVar12;
    }
    uVar12 = *(uint *)((long)tx_size_high_unit + (ulong)((uint)tx_size * 4));
    uVar19 = 0;
    uVar16 = 0;
    do {
      uVar16 = (ulong)(uint)((int)uVar16 +
                            (int)*(char *)((long)&get_txb_ctx_general_signs +
                                          (ulong)((byte)a[uVar19] >> 3)));
      uVar19 = uVar19 + 1;
    } while (uVar18 != uVar19);
    uVar19 = 1;
    if (1 < (int)uVar12) {
      uVar19 = (ulong)uVar12;
    }
    uVar20 = 0;
    do {
      uVar16 = (long)(int)uVar16 +
               (long)*(char *)((long)&get_txb_ctx_general_signs + (ulong)((byte)l[uVar20] >> 3));
      uVar20 = uVar20 + 1;
    } while (uVar19 != uVar20);
    txb_ctx->dc_sign_ctx = (int)(char)get_txb_ctx_general_dc_sign_contexts[uVar16 + 0x20];
    if (plane == 0) {
      if (txsize_to_bsize[uVar15] != plane_bsize) {
        uVar15 = 0;
        uVar12 = 0;
        do {
          uVar12 = uVar12 | (byte)a[uVar15];
          uVar15 = uVar15 + 1;
        } while (uVar18 != uVar15);
        uVar15 = 0;
        uVar14 = 0;
        do {
          uVar14 = uVar14 | (byte)l[uVar15];
          uVar15 = uVar15 + 1;
        } while (uVar19 != uVar15);
        goto LAB_002362cb;
      }
      goto LAB_0023629f;
    }
    switch(uVar15) {
    case 0:
      bVar21 = *a == '\0';
      goto LAB_00236363;
    case 1:
      bVar21 = *(short *)a == 0;
      goto LAB_00236385;
    case 2:
      bVar21 = *(int *)a == 0;
      break;
    case 3:
      bVar21 = *(long *)a == 0;
      goto LAB_00236331;
    case 4:
      bVar21 = *(long *)(a + 8) == 0 && *(long *)a == 0;
      goto LAB_00236349;
    case 5:
      bVar21 = *a == '\0';
      goto LAB_00236385;
    case 6:
      bVar21 = *(short *)a == 0;
      goto LAB_00236363;
    case 7:
      bVar21 = *(short *)a == 0;
      break;
    case 8:
      bVar21 = *(int *)a == 0;
      goto LAB_00236385;
    case 9:
      bVar21 = *(int *)a == 0;
      goto LAB_00236331;
    case 10:
      bVar21 = *(long *)a == 0;
      break;
    case 0xb:
      bVar21 = *(long *)a == 0;
      goto LAB_00236349;
    case 0xc:
      bVar21 = *(long *)(a + 8) == 0 && *(long *)a == 0;
      goto LAB_00236331;
    case 0xd:
      bVar21 = *a == '\0';
      break;
    case 0xe:
      bVar21 = *(int *)a == 0;
LAB_00236363:
      bVar21 = !bVar21;
      bVar22 = *l == '\0';
      goto LAB_0023638d;
    case 0xf:
      bVar21 = *(short *)a == 0;
LAB_00236331:
      bVar21 = !bVar21;
      bVar22 = *(long *)l == 0;
      goto LAB_0023638d;
    case 0x10:
      bVar21 = *(long *)a == 0;
LAB_00236385:
      bVar21 = !bVar21;
      bVar22 = *(short *)l == 0;
      goto LAB_0023638d;
    case 0x11:
      bVar21 = *(int *)a == 0;
LAB_00236349:
      bVar21 = !bVar21;
      bVar22 = *(long *)(l + 8) == 0 && *(long *)l == 0;
      goto LAB_0023638d;
    case 0x12:
      bVar21 = *(long *)(a + 8) == 0 && *(long *)a == 0;
      break;
    default:
      bVar21 = false;
      bVar22 = false;
      goto LAB_00236390;
    }
    bVar21 = !bVar21;
    bVar22 = *(int *)l == 0;
LAB_0023638d:
    bVar22 = !bVar22;
LAB_00236390:
    uVar12 = (uint)("\x04\x05\x05\x06\a\a\b\t\t\n\v\v\f\r\r\x0e\x06\x06\b\b\n\n"
                    [txsize_to_bsize[uVar15]] <
                   "\x04\x05\x05\x06\a\a\b\t\t\n\v\v\f\r\r\x0e\x06\x06\b\b\n\n"[plane_bsize]) * 3 +
             (uint)bVar22 + (uint)bVar21 + 7;
    goto LAB_002363c2;
  }
  uVar12 = (iVar11 - (uint)bVar21) + 8;
LAB_002363c2:
  txb_ctx->txb_skip_ctx = uVar12;
  return;
}

Assistant:

static inline void get_txb_ctx(const BLOCK_SIZE plane_bsize,
                               const TX_SIZE tx_size, const int plane,
                               const ENTROPY_CONTEXT *const a,
                               const ENTROPY_CONTEXT *const l,
                               TXB_CTX *const txb_ctx) {
  switch (tx_size) {
    case TX_4X4: get_txb_ctx_4x4(plane_bsize, plane, a, l, txb_ctx); break;
    case TX_8X8: get_txb_ctx_8x8(plane_bsize, plane, a, l, txb_ctx); break;
    case TX_16X16: get_txb_ctx_16x16(plane_bsize, plane, a, l, txb_ctx); break;
    case TX_32X32: get_txb_ctx_32x32(plane_bsize, plane, a, l, txb_ctx); break;
    default:
      get_txb_ctx_general(plane_bsize, tx_size, plane, a, l, txb_ctx);
      break;
  }
}